

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaEquiv.c
# Opt level: O1

void Gia_ManOrigIdsStart(Gia_Man_t *p)

{
  int iVar1;
  Vec_Int_t *pVVar2;
  int *piVar3;
  int iVar4;
  
  if (p->vIdsOrig != (Vec_Int_t *)0x0) {
    piVar3 = p->vIdsOrig->pArray;
    if (piVar3 != (int *)0x0) {
      free(piVar3);
      p->vIdsOrig->pArray = (int *)0x0;
    }
    if (p->vIdsOrig != (Vec_Int_t *)0x0) {
      free(p->vIdsOrig);
      p->vIdsOrig = (Vec_Int_t *)0x0;
    }
  }
  iVar1 = p->nObjs;
  pVVar2 = (Vec_Int_t *)malloc(0x10);
  iVar4 = 0x10;
  if (0xe < iVar1 - 1U) {
    iVar4 = iVar1;
  }
  pVVar2->nSize = 0;
  pVVar2->nCap = iVar4;
  if (iVar4 == 0) {
    piVar3 = (int *)0x0;
  }
  else {
    piVar3 = (int *)malloc((long)iVar4 << 2);
  }
  pVVar2->pArray = piVar3;
  pVVar2->nSize = iVar1;
  if (piVar3 != (int *)0x0) {
    memset(piVar3,0xff,(long)iVar1 << 2);
  }
  p->vIdsOrig = pVVar2;
  return;
}

Assistant:

void Gia_ManOrigIdsStart( Gia_Man_t * p )
{
    Vec_IntFreeP( &p->vIdsOrig );
    p->vIdsOrig = Vec_IntStartFull( Gia_ManObjNum(p) );
}